

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O0

void PatchRandoWorldEdits::remove_verla_soldiers_on_verla_spawn(World *world)

{
  bool bVar1;
  SpawnLocation *this;
  string *__lhs;
  vector<Flag,std::allocator<Flag>> *pvVar2;
  RandomizerWorld *randomizer_world;
  World *world_local;
  
  this = RandomizerWorld::spawn_location((RandomizerWorld *)world);
  __lhs = SpawnLocation::node_id_abi_cxx11_(this);
  bVar1 = std::operator==(__lhs,"verla");
  if (bVar1) {
    pvVar2 = (vector<Flag,std::allocator<Flag>> *)World::starting_flags(world);
    std::vector<Flag,std::allocator<Flag>>::emplace_back<Flag_const&>
              (pvVar2,&FLAG_VERLA_WHITE_KNIGHTS_KILLED);
    pvVar2 = (vector<Flag,std::allocator<Flag>> *)World::starting_flags(world);
    std::vector<Flag,std::allocator<Flag>>::emplace_back<Flag_const&>
              (pvVar2,&FLAG_VERLA_GOLDEN_KNIGHT_KILLED);
  }
  return;
}

Assistant:

static void remove_verla_soldiers_on_verla_spawn(World& world)
    {
        RandomizerWorld& randomizer_world = reinterpret_cast<RandomizerWorld&>(world);
        if(randomizer_world.spawn_location()->node_id() == "verla")
        {
            world.starting_flags().emplace_back(FLAG_VERLA_WHITE_KNIGHTS_KILLED);
            world.starting_flags().emplace_back(FLAG_VERLA_GOLDEN_KNIGHT_KILLED);
        }
    }